

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O0

bool is_best(result *lhs,result *rhs,objective_function_type type)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  objective_function_type type_local;
  result *rhs_local;
  result *lhs_local;
  
  bVar2 = baryonyx::result::operator_cast_to_bool(lhs);
  if (bVar2) {
    bVar2 = baryonyx::result::operator_cast_to_bool(rhs);
    if (bVar2) {
      if (type == maximize) {
        pvVar3 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                           (&lhs->solutions);
        dVar1 = pvVar3->value;
        pvVar3 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                           (&rhs->solutions);
        lhs_local._7_1_ = pvVar3->value < dVar1;
      }
      else {
        pvVar3 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                           (&lhs->solutions);
        dVar1 = pvVar3->value;
        pvVar3 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                           (&rhs->solutions);
        lhs_local._7_1_ = dVar1 < pvVar3->value;
      }
    }
    else {
      lhs_local._7_1_ = true;
    }
  }
  else {
    bVar2 = baryonyx::result::operator_cast_to_bool(rhs);
    if (bVar2) {
      lhs_local._7_1_ = false;
    }
    else {
      lhs_local._7_1_ = lhs->constraints < rhs->constraints;
    }
  }
  return lhs_local._7_1_;
}

Assistant:

static bool
is_best(const baryonyx::result& lhs,
        const baryonyx::result& rhs,
        baryonyx::objective_function_type type)
{
    if (lhs) {
        if (rhs) {
            if (type == baryonyx::objective_function_type::maximize) {
                return lhs.solutions.front().value >
                       rhs.solutions.front().value;
            } else {
                return lhs.solutions.front().value <
                       rhs.solutions.front().value;
            }
        } else {
            return true;
        }
    } else {
        if (rhs) {
            return false;
        } else {
            return lhs.constraints < rhs.constraints;
        }
    }
}